

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.h
# Opt level: O3

void __thiscall
TPZFYsmpMatrix<std::complex<float>_>::SetData
          (TPZFYsmpMatrix<std::complex<float>_> *this,int64_t *IA,int64_t *JA,complex<float> *A)

{
  long lVar1;
  int iVar2;
  int __c;
  
  iVar2 = (int)(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  __c = iVar2 + 1;
  (*(this->fIA)._vptr_TPZVec[3])(&this->fIA,(long)__c);
  memccpy((this->fIA).fStore,IA,__c,8);
  lVar1 = (this->fIA).fStore[iVar2];
  (*(this->fJA)._vptr_TPZVec[3])(&this->fJA,lVar1);
  memccpy((this->fJA).fStore,JA,(int)lVar1,8);
  (*(this->fA)._vptr_TPZVec[3])(&this->fA,lVar1);
  memccpy((this->fA).fStore,A,(int)lVar1,8);
  ComputeDiagonal(this);
  return;
}

Assistant:

inline void TPZFYsmpMatrix<TVar>::SetData( int64_t *IA, int64_t *JA, TVar *A ) {
	// Pass the data to the class.
    int nel = this->Rows()+1;
    fIA.resize(nel);
    memccpy(&fIA[0], IA, nel, sizeof(int64_t));
    int64_t nval = fIA[nel-1];
    fJA.resize(nval);
    memccpy(&fJA[0], JA, nval, sizeof(int64_t));
    fA.resize(nval);
    memccpy(&fA[0], A, nval, sizeof(TVar));
	ComputeDiagonal();
}